

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

char * xml_strtok_r(char *str,char *delim,char **nextp)

{
  size_t sVar1;
  char *pcVar2;
  char *ret;
  char **nextp_local;
  char *delim_local;
  char *str_local;
  
  delim_local = str;
  if (str == (char *)0x0) {
    delim_local = *nextp;
  }
  sVar1 = strspn(delim_local,delim);
  str_local = delim_local + sVar1;
  if (*str_local == '\0') {
    str_local = (char *)0x0;
  }
  else {
    sVar1 = strcspn(str_local,delim);
    pcVar2 = str_local + sVar1;
    delim_local = pcVar2;
    if (*pcVar2 != '\0') {
      delim_local = pcVar2 + 1;
      *pcVar2 = '\0';
    }
    *nextp = delim_local;
  }
  return str_local;
}

Assistant:

static char* xml_strtok_r(char *str, const char *delim, char **nextp) {
	char *ret;

	if (str == NULL) {
		str = *nextp;
	}

	str += strspn(str, delim);

	if (*str == '\0') {
		return NULL;
	}

	ret = str;

	str += strcspn(str, delim);

	if (*str) {
		*str++ = '\0';
	}

	*nextp = str;

	return ret;
}